

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O2

void duckdb::ApproxQuantileListOperation<duckdb::dtime_tz_t>::
     Finalize<duckdb::list_entry_t,duckdb::ApproxQuantileState>
               (ApproxQuantileState *state,list_entry_t *target,AggregateFinalizeData *finalize_data
               )

{
  FunctionData *pFVar1;
  Vector *pVVar2;
  idx_t iVar3;
  reference pvVar4;
  size_t q;
  ulong __n;
  uint64_t uVar5;
  dtime_tz_t *target_00;
  Value local_38;
  
  if (state->pos != 0) {
    pFVar1 = optional_ptr<duckdb::FunctionData,_true>::operator->(&finalize_data->input->bind_data);
    pVVar2 = ListVector::GetEntry(finalize_data->result);
    iVar3 = ListVector::GetListSize(finalize_data->result);
    ListVector::Reserve(finalize_data->result,
                        ((long)pFVar1[2]._vptr_FunctionData - (long)pFVar1[1]._vptr_FunctionData >>
                        2) + iVar3);
    target_00 = (dtime_tz_t *)(pVVar2->data + iVar3 * 8);
    duckdb_tdigest::TDigest::process(state->h);
    target->offset = iVar3;
    uVar5 = (long)pFVar1[2]._vptr_FunctionData - (long)pFVar1[1]._vptr_FunctionData >> 2;
    target->length = uVar5;
    for (__n = 0; __n < uVar5; __n = __n + 1) {
      pvVar4 = vector<float,_true>::get<true>((vector<float,_true> *)(pFVar1 + 1),__n);
      local_38 = duckdb_tdigest::TDigest::quantile(state->h,(double)*pvVar4);
      ApproxQuantileCoding::Decode<double,duckdb::dtime_tz_t>(&local_38,target_00);
      uVar5 = target->length;
      target_00 = target_00 + 1;
    }
    ListVector::SetListSize(finalize_data->result,uVar5 + target->offset);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, RESULT_TYPE &target, AggregateFinalizeData &finalize_data) {
		if (state.pos == 0) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->template Cast<ApproximateQuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		D_ASSERT(state.h);
		state.h->compress();

		auto &entry = target;
		entry.offset = ridx;
		entry.length = bind_data.quantiles.size();
		for (size_t q = 0; q < entry.length; ++q) {
			const auto &quantile = bind_data.quantiles[q];
			const auto &source = state.h->quantile(quantile);
			auto &target = rdata[ridx + q];
			ApproxQuantileCoding::Decode(source, target);
		}

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}